

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

vec<3,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined4 uVar1;
  undefined4 uVar2;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar3;
  CanonicalDataSource CVar4;
  pointer pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *buff;
  uvec3 uVar6;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar7;
  string sStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined8 uVar8;
  anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7 aVar9;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar4 = currentCanonicalDataSource(this);
  if (CVar4 == RenderBuffer) {
    buff = (this->renderAttributeBuffer).
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (buff->dataSize <= (long)ind) {
      std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
      std::operator+(&local_d8,&local_98," getValue(");
      std::__cxx11::to_string(&sStack_f8,ind);
      std::operator+(&local_b8,&local_d8,&sStack_f8);
      std::operator+(&local_78,&local_b8,")");
      exception(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      buff = (this->renderAttributeBuffer).
             super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    }
    uVar6 = getAttributeBufferData<glm::vec<3,unsigned_int,(glm::qualifier)0>>(buff,ind);
    vVar7.field_0 = uVar6.field_0;
    uVar8._4_4_ = uVar6.field_1;
    register0x00000010 = uVar6.field_2;
    return vVar7;
  }
  if (CVar4 == NeedsCompute) {
    std::function<void_()>::operator()(&this->computeFunc);
    pvVar5 = (this->data->
             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (ind < (ulong)(((long)(this->data->
                             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0xc))
    goto LAB_001ef765;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_58,&local_b8,")");
    exception(&local_58);
    this_00 = &local_58;
  }
  else {
    if (CVar4 != HostData) {
      return (vec<3,_unsigned_int,_(glm::qualifier)0>)ZEXT412(0);
    }
    pvVar5 = (this->data->
             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (ind < (ulong)(((long)(this->data->
                             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0xc))
    goto LAB_001ef765;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_38,&local_b8,")");
    exception(&local_38);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  pvVar5 = (this->data->
           super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_001ef765:
  uVar1 = pvVar5[ind].field_0;
  uVar2 = pvVar5[ind].field_1;
  vVar3.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_unsigned_int,_(glm::qualifier)0>_5)uVar2;
  vVar3.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_unsigned_int,_(glm::qualifier)0>_3)uVar1;
  vVar3.field_2.z = pvVar5[ind].field_2.z;
  return vVar3;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}